

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_opt.c
# Opt level: O0

int tnt_opt_init(tnt_opt *opt)

{
  uri *puVar1;
  tnt_opt *opt_local;
  
  memset(opt,0,0x78);
  opt->recv_buf = 0x4000;
  opt->send_buf = 0x4000;
  (opt->tmout_connect).tv_sec = 0x10;
  (opt->tmout_connect).tv_usec = 0;
  puVar1 = (uri *)tnt_mem_alloc(0x88);
  opt->uri = puVar1;
  if (opt->uri == (uri *)0x0) {
    opt_local._4_4_ = -1;
  }
  else {
    opt_local._4_4_ = 0;
  }
  return opt_local._4_4_;
}

Assistant:

int
tnt_opt_init(struct tnt_opt *opt)
{
	memset(opt, 0, sizeof(struct tnt_opt));
	opt->recv_buf = 16384;
	opt->send_buf = 16384;
	opt->tmout_connect.tv_sec = 16;
	opt->tmout_connect.tv_usec = 0;
	opt->uri = tnt_mem_alloc(sizeof(struct uri));
	if (!opt->uri) return -1;
	return 0;
}